

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

void ra_shift_tail(roaring_array_t *ra,int32_t count,int32_t distance)

{
  int iVar1;
  long lVar2;
  size_t __n;
  
  if (0 < distance) {
    extend_array(ra,distance);
  }
  __n = (size_t)count;
  lVar2 = (long)ra->size - __n;
  iVar1 = (int)lVar2 + distance;
  memmove(ra->keys + iVar1,ra->keys + lVar2,__n * 2);
  memmove(ra->containers + iVar1,ra->containers + lVar2,__n * 8);
  memmove(ra->typecodes + iVar1,ra->typecodes + lVar2,__n);
  ra->size = ra->size + distance;
  return;
}

Assistant:

void ra_shift_tail(roaring_array_t *ra, int32_t count, int32_t distance) {
    if (distance > 0) {
        extend_array(ra, distance);
    }
    int32_t srcpos = ra->size - count;
    int32_t dstpos = srcpos + distance;
    memmove(&(ra->keys[dstpos]), &(ra->keys[srcpos]), sizeof(uint16_t) * count);
    memmove(&(ra->containers[dstpos]), &(ra->containers[srcpos]),
            sizeof(container_t *) * count);
    memmove(&(ra->typecodes[dstpos]), &(ra->typecodes[srcpos]),
            sizeof(uint8_t) * count);
    ra->size += distance;
}